

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void luaV_concat(lua_State *L,int total)

{
  StkId obj;
  lua_CFunction p_Var1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  TString *pTVar5;
  int iVar6;
  ulong uVar7;
  StkId top;
  TValue *io1;
  StkId p1;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong l;
  char buff [40];
  
  uVar7 = (ulong)(uint)total;
  top = L->top;
  do {
    iVar6 = (int)uVar7;
    p1 = top + -2;
    iVar8 = 1;
    iVar9 = iVar8;
    if ((top[-2].tt_ & 0xfU) - 3 < 2) {
      obj = top + -1;
      uVar3 = top[-1].tt_;
      if ((uVar3 & 0xf) != 4) {
        if ((uVar3 & 0xf) != 3) goto LAB_0011fd26;
        luaO_tostring(L,obj);
        uVar3 = top[-1].tt_;
      }
      if (uVar3 == 0x44) {
        uVar3 = top[-2].tt_;
        if (top[-1].value_.f[0xb] == (_func_int_lua_State_ptr)0x0) {
          iVar9 = 1;
          if ((uVar3 & 0xf) == 3) {
            luaO_tostring(L,p1);
            iVar9 = iVar8;
          }
          goto LAB_0011fe59;
        }
      }
      else {
        uVar3 = top[-2].tt_;
      }
      if ((uVar3 == 0x44) && ((p1->value_).f[0xb] == (_func_int_lua_State_ptr)0x0)) {
        iVar8 = top[-1].tt_;
        uVar2 = *(undefined4 *)&top[-1].field_0xc;
        p1->value_ = obj->value_;
        top[-2].tt_ = iVar8;
        *(undefined4 *)&top[-2].field_0xc = uVar2;
      }
      else {
        p_Var1 = (obj->value_).f;
        if (p_Var1[8] == (_func_int_lua_State_ptr)0x4) {
          l = (ulong)(byte)p_Var1[0xb];
        }
        else {
          l = *(ulong *)(p_Var1 + 0x10);
        }
        uVar10 = 1;
        if (1 < iVar6) {
          uVar10 = uVar7;
        }
        for (uVar7 = 1; (long)uVar7 < (long)iVar6; uVar7 = uVar7 + 1) {
          uVar3 = p1->tt_ & 0xf;
          if (uVar3 != 4) {
            if (uVar3 != 3) {
              uVar10 = uVar7 & 0xffffffff;
              break;
            }
            luaO_tostring(L,p1);
          }
          p_Var1 = (p1->value_).f;
          if (p_Var1[8] == (_func_int_lua_State_ptr)0x4) {
            uVar4 = (ulong)(byte)p_Var1[0xb];
          }
          else {
            uVar4 = *(ulong *)(p_Var1 + 0x10);
          }
          if ((l ^ 0x7fffffffffffffff) <= uVar4) {
            luaG_runerror(L,"string length overflow");
          }
          l = l + uVar4;
          p1 = p1 + -1;
        }
        iVar9 = (int)uVar10;
        if (l < 0x29) {
          copy2buff(top,iVar9,buff);
          pTVar5 = luaS_newlstr(L,buff,l);
        }
        else {
          pTVar5 = luaS_createlngstrobj(L,l);
          copy2buff(top,iVar9,(char *)(pTVar5 + 1));
        }
        top[-uVar10].value_.gc = (GCObject *)pTVar5;
        top[-uVar10].tt_ = pTVar5->tt | 0x40;
        iVar9 = iVar9 + -1;
      }
    }
    else {
LAB_0011fd26:
      luaT_trybinTM(L,p1,top + -1,p1,TM_CONCAT);
    }
LAB_0011fe59:
    uVar7 = (ulong)(uint)(iVar6 - iVar9);
    top = L->top + -(long)iVar9;
    L->top = top;
    if (iVar6 - iVar9 < 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  lua_assert(total >= 2);
  do {
    StkId top = L->top;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(top-2) || cvt2str(top-2)) || !tostring(L, top-1))
      luaT_trybinTM(L, top-2, top-1, top-2, TM_CONCAT);
    else if (isemptystr(top - 1))  /* second operand is empty? */
      cast_void(tostring(L, top - 2));  /* result is first operand */
    else if (isemptystr(top - 2)) {  /* first operand is an empty string? */
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = vslen(top - 1);
      TString *ts;
      /* collect total length and number of strings */
      for (n = 1; n < total && tostring(L, top - n - 1); n++) {
        size_t l = vslen(top - n - 1);
        if (l >= (MAX_SIZE/sizeof(char)) - tl)
          luaG_runerror(L, "string length overflow");
        tl += l;
      }
      if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
        char buff[LUAI_MAXSHORTLEN];
        copy2buff(top, n, buff);  /* copy strings to buffer */
        ts = luaS_newlstr(L, buff, tl);
      }
      else {  /* long string; copy strings directly to final result */
        ts = luaS_createlngstrobj(L, tl);
        copy2buff(top, n, getstr(ts));
      }
      setsvalue2s(L, top - n, ts);  /* create result */
    }
    total -= n-1;  /* got 'n' strings to create 1 new */
    L->top -= n-1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}